

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void update_partition_context
               (MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE subsize,BLOCK_SIZE bsize)

{
  byte bVar1;
  byte in_CL;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  byte in_R8B;
  int bh;
  int bw;
  PARTITION_CONTEXT *left_ctx;
  PARTITION_CONTEXT *above_ctx;
  
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R8B];
  memset((void *)(*(long *)(in_RDI + 0x1f98) + (long)in_EDX),
         (uint)(byte)partition_context_lookup[in_CL].above,
         (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [in_R8B]);
  memset((void *)(in_RDI + 0x1fa0 + (long)(int)(in_ESI & 0x1f)),
         (uint)(byte)partition_context_lookup[in_CL].left,(long)(int)(uint)bVar1);
  return;
}

Assistant:

static inline void update_partition_context(MACROBLOCKD *xd, int mi_row,
                                            int mi_col, BLOCK_SIZE subsize,
                                            BLOCK_SIZE bsize) {
  PARTITION_CONTEXT *const above_ctx = xd->above_partition_context + mi_col;
  PARTITION_CONTEXT *const left_ctx =
      xd->left_partition_context + (mi_row & MAX_MIB_MASK);

  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  memset(above_ctx, partition_context_lookup[subsize].above, bw);
  memset(left_ctx, partition_context_lookup[subsize].left, bh);
}